

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_DeleteFldStrict<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  PropertyId propertyId;
  Var pvVar1;
  
  pvVar1 = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,pvVar1,false,true);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),playout->PropertyIdIndex);
  pvVar1 = JavascriptOperators::OP_DeleteProperty
                     (pvVar1,propertyId,*(ScriptContext **)(this + 0x78),
                      PropertyOperation_StrictMode);
  SetReg<unsigned_int>(this,playout->Value,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_DeleteFldStrict(const unaligned T * playout)
    {
        Var result = JavascriptOperators::OP_DeleteProperty(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext(), PropertyOperation_StrictMode);
        SetReg(playout->Value, result);
    }